

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aegis128x2.cc
# Opt level: O1

int aead_aegis_128x2_seal_scatter
              (EVP_AEAD_CTX *ctx,uint8_t *out,uint8_t *out_tag,size_t *out_tag_len,
              size_t max_out_tag_len,uint8_t *nonce,size_t nonce_len,uint8_t *in,size_t in_len,
              uint8_t *extra_in,size_t extra_in_len,uint8_t *ad,size_t ad_len)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int reason;
  int line;
  ulong uVar5;
  longlong local_340 [4];
  undefined1 local_320 [32];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  ulong local_210;
  ulong *local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  
  local_210 = (ulong)ctx->tag_len;
  if (max_out_tag_len < local_210) {
    reason = 0x67;
    line = 0x112;
  }
  else {
    if (nonce_len < 0x11) {
      local_208 = out_tag_len;
      aegis_128x2_state_init((ctx->state).opaque,nonce,nonce_len,&local_340);
      if (0x3f < ad_len) {
        halt_baddata();
      }
      uVar5 = ad_len & 0x3f;
      if (uVar5 != 0) {
        memset((void *)((long)&local_200 + uVar5),0,0x40 - uVar5);
        memcpy(&local_200,ad,uVar5);
      }
      if (0x3f < in_len) {
        auVar1._8_8_ = uStack_2f8;
        auVar1._0_8_ = local_300;
        auVar1._16_8_ = uStack_2f0;
        auVar1._24_8_ = uStack_2e8;
        auVar2._8_8_ = uStack_2d8;
        auVar2._0_8_ = local_2e0;
        auVar2._16_8_ = uStack_2d0;
        auVar2._24_8_ = uStack_2c8;
        auVar3._8_8_ = uStack_278;
        auVar3._0_8_ = local_280;
        auVar3._16_8_ = uStack_270;
        auVar3._24_8_ = uStack_268;
        auVar4._8_8_ = uStack_258;
        auVar4._0_8_ = local_260;
        auVar4._16_8_ = uStack_250;
        auVar4._24_8_ = uStack_248;
        auVar1 = vpand_avx2(auVar1,auVar2);
        vpand_avx2(auVar3,auVar4);
        *(undefined1 (*) [32])out = local_320 ^ auVar3 ^ auVar1 ^ *(undefined1 (*) [32])in;
        halt_baddata();
      }
      local_1e0 = 0;
      uStack_1d8 = 0;
      uStack_1d0 = 0;
      uStack_1c8 = 0;
      local_200 = 0;
      uStack_1f8 = 0;
      uStack_1f0 = 0;
      uStack_1e8 = 0;
      if (extra_in_len == 0) {
        if (in_len == 0) {
          local_1e0 = 0;
          uStack_1d8 = 0;
          uStack_1d0 = 0;
          uStack_1c8 = 0;
          local_200 = 0;
          uStack_1f8 = 0;
          uStack_1f0 = 0;
          uStack_1e8 = 0;
          aead_aegis_128x2_tag(out_tag,ad_len,0,&local_340);
          *local_208 = local_210;
          return 1;
        }
        memcpy(&local_200,in,in_len);
      }
      uVar5 = 0x40 - in_len;
      if (extra_in_len <= 0x40 - in_len) {
        uVar5 = extra_in_len;
      }
      if (in_len != 0) {
        memcpy(&local_200,in,in_len);
      }
      memcpy(&local_200,extra_in,uVar5);
    }
    reason = 0x79;
    line = 0x116;
  }
  ERR_put_error(0x1e,0,reason,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aegis128x2.cc"
                ,line);
  return 0;
}

Assistant:

static int aead_aegis_128x2_seal_scatter(
    const EVP_AEAD_CTX *ctx, uint8_t *out, uint8_t *out_tag,
    size_t *out_tag_len, size_t max_out_tag_len, const uint8_t *nonce,
    size_t nonce_len, const uint8_t *in, size_t in_len, const uint8_t *extra_in,
    size_t extra_in_len, const uint8_t *ad, size_t ad_len) {
  const struct aead_aegis_128x2_ctx *aegis_ctx =
      (struct aead_aegis_128x2_ctx *)&ctx->state;

  return aegis_128x2_seal_scatter(
      aegis_ctx->key, out, out_tag, out_tag_len, max_out_tag_len, nonce,
      nonce_len, in, in_len, extra_in, extra_in_len, ad, ad_len, ctx->tag_len);
}